

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

void __thiscall
kj::_::AdapterPromiseNode<int,_kj::UnixEventPort::ChildExitPromiseAdapter>::fulfill
          (AdapterPromiseNode<int,_kj::UnixEventPort::ChildExitPromiseAdapter> *this,int *value)

{
  int *value_00;
  ExceptionOr<int> local_1b8;
  int *local_18;
  int *value_local;
  AdapterPromiseNode<int,_kj::UnixEventPort::ChildExitPromiseAdapter> *this_local;
  
  if ((this->waiting & 1U) != 0) {
    this->waiting = false;
    local_18 = value;
    value_local = (int *)this;
    value_00 = mv<int>(value);
    ExceptionOr<int>::ExceptionOr(&local_1b8,value_00);
    ExceptionOr<int>::operator=(&this->result,&local_1b8);
    ExceptionOr<int>::~ExceptionOr(&local_1b8);
    AdapterPromiseNodeBase::setReady(&this->super_AdapterPromiseNodeBase);
  }
  return;
}

Assistant:

void fulfill(T&& value) override {
    if (waiting) {
      waiting = false;
      result = ExceptionOr<T>(kj::mv(value));
      setReady();
    }
  }